

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

char * ssl_tls13_get_hs_msg_name(int hs_msg_type)

{
  char *pcStack_10;
  int hs_msg_type_local;
  
  switch(hs_msg_type) {
  case 1:
    pcStack_10 = "ClientHello";
    break;
  case 2:
    pcStack_10 = "ServerHello";
    break;
  case 4:
    pcStack_10 = "NewSessionTicket";
    break;
  case 8:
    pcStack_10 = "EncryptedExtensions";
    break;
  case 0xb:
    pcStack_10 = "Certificate";
    break;
  case 0xd:
    pcStack_10 = "CertificateRequest";
    break;
  case -2:
    pcStack_10 = "HelloRetryRequest";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

static const char *ssl_tls13_get_hs_msg_name(int hs_msg_type)
{
    switch (hs_msg_type) {
        case MBEDTLS_SSL_HS_CLIENT_HELLO:
            return "ClientHello";
        case MBEDTLS_SSL_HS_SERVER_HELLO:
            return "ServerHello";
        case MBEDTLS_SSL_TLS1_3_HS_HELLO_RETRY_REQUEST:
            return "HelloRetryRequest";
        case MBEDTLS_SSL_HS_NEW_SESSION_TICKET:
            return "NewSessionTicket";
        case MBEDTLS_SSL_HS_ENCRYPTED_EXTENSIONS:
            return "EncryptedExtensions";
        case MBEDTLS_SSL_HS_CERTIFICATE:
            return "Certificate";
        case MBEDTLS_SSL_HS_CERTIFICATE_REQUEST:
            return "CertificateRequest";
    }
    return "Unknown";
}